

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O3

int crnlib::LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  UInt16 *pUVar4;
  Byte *pBVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  Byte *pBVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  UInt16 *pUVar16;
  ulong uVar17;
  ulong uVar18;
  UInt32 UVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  UInt32 UVar25;
  uint uVar26;
  uint uVar27;
  byte *pbVar28;
  ushort *puVar29;
  uint uVar30;
  uint uVar31;
  UInt32 mask;
  ulong uVar32;
  uint local_d0;
  UInt32 local_cc;
  UInt32 local_c8;
  UInt32 local_b8;
  ulong local_90;
  
  uVar32 = p->dicPos;
  do {
    UVar25 = p->processedPos;
    uVar15 = p->checkDicSize;
    local_90 = limit;
    if ((uVar15 == 0) &&
       (uVar10 = (ulong)((p->prop).dicSize - UVar25), local_90 = uVar32 + uVar10,
       limit - uVar32 <= uVar10)) {
      local_90 = limit;
    }
    pUVar4 = p->probs;
    uVar27 = p->state;
    local_d0 = p->reps[0];
    local_c8 = p->reps[1];
    local_cc = p->reps[2];
    uVar7 = (p->prop).pb;
    local_b8 = p->reps[3];
    uVar8 = (p->prop).lp;
    pBVar5 = p->dic;
    uVar10 = p->dicBufSize;
    pbVar28 = p->buf;
    uVar22 = p->range;
    uVar9 = p->code;
    bVar2 = (byte)(p->prop).lc;
    uVar20 = 0;
LAB_001969cc:
    UVar19 = local_b8;
    uVar24 = local_d0;
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar9 = (uint)bVar1 | uVar9 << 8;
    }
    uVar13 = UVar25 & ~(-1 << ((byte)uVar7 & 0x1f));
    uVar17 = (ulong)uVar13;
    uVar18 = (ulong)(uVar27 << 4);
    uVar3 = pUVar4[uVar18 + uVar17];
    uVar23 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar30 = uVar9 - uVar23;
    if (uVar9 < uVar23) {
      pUVar4[uVar18 + uVar17] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar16 = pUVar4 + 0x736;
      if (UVar25 != 0 || uVar15 != 0) {
        uVar17 = uVar32;
        if (uVar32 == 0) {
          uVar17 = uVar10;
        }
        pUVar16 = pUVar4 + 0x736 +
                  ((uint)(pBVar5[uVar17 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((UVar25 & ~(-1 << ((byte)uVar8 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      uVar22 = uVar23;
      if (uVar27 < 7) {
        uVar17 = 1;
        do {
          uVar24 = uVar22;
          if (uVar22 < 0x1000000) {
            uVar24 = uVar22 << 8;
            bVar1 = *pbVar28;
            pbVar28 = pbVar28 + 1;
            uVar9 = uVar9 << 8 | (uint)bVar1;
          }
          uVar3 = pUVar16[uVar17];
          uVar22 = (uVar24 >> 0xb) * (uint)uVar3;
          uVar30 = (int)uVar17 * 2;
          uVar13 = uVar9 - uVar22;
          if (uVar9 < uVar22) {
            sVar6 = (short)(0x800 - uVar3 >> 5);
          }
          else {
            uVar22 = uVar24 - uVar22;
            sVar6 = -(uVar3 >> 5);
            uVar30 = uVar30 | 1;
            uVar9 = uVar13;
          }
          uVar21 = (ulong)uVar30;
          pUVar16[uVar17] = sVar6 + uVar3;
          uVar17 = uVar21;
        } while (uVar30 < 0x100);
      }
      else {
        uVar17 = 0;
        if (uVar32 < local_d0) {
          uVar17 = uVar10;
        }
        uVar24 = (uint)p->dic[uVar17 + (uVar32 - local_d0)];
        uVar17 = 1;
        uVar30 = 0x100;
        do {
          uVar13 = uVar9;
          uVar23 = uVar22;
          if (uVar22 < 0x1000000) {
            uVar23 = uVar22 << 8;
            bVar1 = *pbVar28;
            pbVar28 = pbVar28 + 1;
            uVar13 = uVar9 << 8 | (uint)bVar1;
          }
          uVar24 = uVar24 * 2;
          uVar31 = uVar24 & uVar30;
          uVar18 = (ulong)uVar31;
          uVar3 = pUVar16[(ulong)uVar30 + uVar18 + uVar17];
          uVar22 = (uVar23 >> 0xb) * (uint)uVar3;
          uVar26 = (int)uVar17 * 2;
          uVar9 = uVar13 - uVar22;
          if (uVar13 < uVar22) {
            sVar6 = (short)(0x800 - uVar3 >> 5);
            uVar31 = uVar31 ^ uVar30;
            uVar9 = uVar13;
          }
          else {
            uVar22 = uVar23 - uVar22;
            sVar6 = -(uVar3 >> 5);
            uVar26 = uVar26 | 1;
          }
          uVar21 = (ulong)uVar26;
          pUVar16[(ulong)uVar30 + uVar18 + uVar17] = sVar6 + uVar3;
          uVar17 = uVar21;
          uVar30 = uVar31;
        } while (uVar26 < 0x100);
      }
      pBVar5[uVar32] = (Byte)uVar21;
      uVar27 = (uint)(byte)kLiteralNextStates[uVar27];
LAB_00196c51:
      uVar32 = uVar32 + 1;
      uVar17 = 1;
      goto LAB_0019764e;
    }
    uVar22 = uVar22 - uVar23;
    pUVar4[uVar18 + uVar17] = uVar3 - (uVar3 >> 5);
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 * 0x100;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar30 = uVar30 * 0x100 | (uint)bVar1;
    }
    uVar3 = pUVar4[(ulong)uVar27 + 0xc0];
    uVar23 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar9 = uVar30 - uVar23;
    if (uVar30 < uVar23) {
      pUVar4[(ulong)uVar27 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
      uVar27 = uVar27 + 0xc;
      puVar29 = pUVar4 + 0x332;
    }
    else {
      pUVar4[(ulong)uVar27 + 0xc0] = uVar3 - (uVar3 >> 5);
      if (UVar25 == 0 && uVar15 == 0) {
        return 1;
      }
      uVar22 = uVar22 - uVar23;
      if (uVar22 < 0x1000000) {
        uVar22 = uVar22 * 0x100;
        bVar1 = *pbVar28;
        pbVar28 = pbVar28 + 1;
        uVar9 = (uint)bVar1 | uVar9 * 0x100;
      }
      uVar3 = pUVar4[(ulong)uVar27 + 0xcc];
      uVar23 = (uVar22 >> 0xb) * (uint)uVar3;
      uVar30 = uVar9 - uVar23;
      if (uVar9 < uVar23) {
        pUVar4[(ulong)uVar27 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar23 < 0x1000000) {
          uVar23 = uVar23 * 0x100;
          bVar1 = *pbVar28;
          pbVar28 = pbVar28 + 1;
          uVar9 = (uint)bVar1 | uVar9 << 8;
        }
        uVar3 = pUVar4[uVar18 + uVar17 + 0xf0];
        uVar22 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar30 = uVar9 - uVar22;
        if (uVar9 < uVar22) {
          pUVar4[uVar18 + uVar17 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar17 = 0;
          if (uVar32 < local_d0) {
            uVar17 = uVar10;
          }
          pBVar5[uVar32] = pBVar5[uVar17 + (uVar32 - local_d0)];
          uVar27 = (uint)(6 < uVar27) * 2 + 9;
          goto LAB_00196c51;
        }
        uVar23 = uVar23 - uVar22;
        pUVar4[uVar18 + uVar17 + 0xf0] = uVar3 - (uVar3 >> 5);
        uVar24 = local_c8;
      }
      else {
        uVar22 = uVar22 - uVar23;
        pUVar4[(ulong)uVar27 + 0xcc] = uVar3 - (uVar3 >> 5);
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar1 = *pbVar28;
          pbVar28 = pbVar28 + 1;
          uVar30 = uVar30 * 0x100 | (uint)bVar1;
        }
        uVar3 = pUVar4[(ulong)uVar27 + 0xd8];
        uVar23 = (uVar22 >> 0xb) * (uint)uVar3;
        uVar9 = uVar30 - uVar23;
        if (uVar30 < uVar23) {
          pUVar4[(ulong)uVar27 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
          local_d0 = local_c8;
        }
        else {
          uVar22 = uVar22 - uVar23;
          pUVar4[(ulong)uVar27 + 0xd8] = uVar3 - (uVar3 >> 5);
          if (uVar22 < 0x1000000) {
            uVar22 = uVar22 * 0x100;
            bVar1 = *pbVar28;
            pbVar28 = pbVar28 + 1;
            uVar9 = uVar9 * 0x100 | (uint)bVar1;
          }
          uVar3 = pUVar4[(ulong)uVar27 + 0xe4];
          uVar23 = (uVar22 >> 0xb) * (uint)uVar3;
          uVar30 = uVar9 - uVar23;
          if (uVar9 < uVar23) {
            sVar6 = (short)(0x800 - uVar3 >> 5);
            uVar30 = uVar9;
            UVar19 = local_cc;
          }
          else {
            uVar23 = uVar22 - uVar23;
            sVar6 = -(uVar3 >> 5);
            local_b8 = local_cc;
          }
          pUVar4[(ulong)uVar27 + 0xe4] = sVar6 + uVar3;
          local_cc = local_c8;
          local_d0 = UVar19;
        }
      }
      uVar27 = (uint)(6 < uVar27) * 3 + 8;
      puVar29 = pUVar4 + 0x534;
      local_c8 = uVar24;
    }
    uVar3 = *puVar29;
    if (uVar23 < 0x1000000) {
      uVar23 = uVar23 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar30 = uVar30 << 8 | (uint)bVar1;
    }
    uVar22 = (uVar23 >> 0xb) * (uint)uVar3;
    uVar20 = uVar30 - uVar22;
    if (uVar30 < uVar22) {
      *puVar29 = (short)(0x800 - uVar3 >> 5) + uVar3;
      puVar29 = puVar29 + (ulong)(uVar13 << 3) + 2;
      iVar14 = 0;
      uVar24 = 8;
      uVar9 = uVar30;
    }
    else {
      uVar23 = uVar23 - uVar22;
      *puVar29 = uVar3 - (uVar3 >> 5);
      if (uVar23 < 0x1000000) {
        uVar23 = uVar23 * 0x100;
        bVar1 = *pbVar28;
        pbVar28 = pbVar28 + 1;
        uVar20 = (uint)bVar1 | uVar20 * 0x100;
      }
      uVar3 = puVar29[1];
      uVar22 = (uVar23 >> 0xb) * (uint)uVar3;
      uVar9 = uVar20 - uVar22;
      if (uVar20 < uVar22) {
        puVar29[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
        puVar29 = puVar29 + (ulong)(uVar13 << 3) + 0x82;
        uVar24 = 8;
        iVar14 = 8;
        uVar9 = uVar20;
      }
      else {
        uVar22 = uVar23 - uVar22;
        puVar29[1] = uVar3 - (uVar3 >> 5);
        puVar29 = puVar29 + 0x102;
        iVar14 = 0x10;
        uVar24 = 0x100;
      }
    }
    uVar17 = 1;
    do {
      uVar3 = puVar29[uVar17];
      uVar20 = uVar22;
      uVar30 = uVar9;
      if (uVar22 < 0x1000000) {
        uVar20 = uVar22 << 8;
        bVar1 = *pbVar28;
        pbVar28 = pbVar28 + 1;
        uVar30 = uVar9 << 8 | (uint)bVar1;
      }
      uVar22 = (uVar20 >> 0xb) * (uint)uVar3;
      uVar13 = (int)uVar17 * 2;
      uVar9 = uVar30 - uVar22;
      if (uVar30 < uVar22) {
        sVar6 = (short)(0x800 - uVar3 >> 5);
        uVar9 = uVar30;
      }
      else {
        uVar22 = uVar20 - uVar22;
        sVar6 = -(uVar3 >> 5);
        uVar13 = uVar13 | 1;
      }
      puVar29[uVar17] = sVar6 + uVar3;
      uVar17 = (ulong)uVar13;
    } while (uVar13 < uVar24);
    uVar20 = (uVar13 - uVar24) + iVar14;
    if (uVar27 < 0xc) {
LAB_001975c3:
      uVar18 = local_90 - uVar32;
      if (uVar18 == 0) {
        return 1;
      }
      uVar20 = uVar20 + 2;
      uVar17 = uVar18 & 0xffffffff;
      if (uVar20 <= uVar18) {
        uVar17 = (ulong)uVar20;
      }
      uVar18 = 0;
      if (uVar32 < local_d0) {
        uVar18 = uVar10;
      }
      uVar18 = uVar18 + (uVar32 - local_d0);
      uVar20 = uVar20 - (int)uVar17;
      if (uVar10 < uVar18 + uVar17) {
        lVar11 = 0;
        do {
          pBVar5[lVar11 + uVar32] = pBVar5[uVar18];
          uVar18 = uVar18 + 1;
          if (uVar18 == uVar10) {
            uVar18 = 0;
          }
          lVar11 = lVar11 + 1;
        } while ((int)uVar17 != (int)lVar11);
        uVar32 = uVar32 + lVar11;
      }
      else {
        pBVar12 = pBVar5 + uVar32;
        uVar21 = uVar17;
        do {
          *pBVar12 = pBVar12[uVar18 - uVar32];
          pBVar12 = pBVar12 + 1;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
        uVar32 = uVar32 + uVar17;
      }
LAB_0019764e:
      UVar25 = UVar25 + (int)uVar17;
      if ((local_90 <= uVar32) || (bufLimit <= pbVar28)) goto LAB_00197663;
      goto LAB_001969cc;
    }
    uVar24 = 3;
    if (uVar20 < 3) {
      uVar24 = uVar20;
    }
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar9 = (uint)bVar1 | uVar9 << 8;
    }
    uVar17 = (ulong)(uVar24 << 7);
    uVar3 = *(ushort *)((long)pUVar4 + uVar17 + 0x362);
    uVar30 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar24 = uVar9 - uVar30;
    if (uVar9 < uVar30) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar22 = 2;
      uVar24 = uVar9;
    }
    else {
      uVar30 = uVar22 - uVar30;
      sVar6 = -(uVar3 >> 5);
      uVar22 = 3;
    }
    lVar11 = uVar17 + 0x360;
    *(ushort *)((long)pUVar4 + uVar17 + 0x362) = sVar6 + uVar3;
    if (uVar30 < 0x1000000) {
      uVar30 = uVar30 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar24 = (uint)bVar1 | uVar24 << 8;
    }
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar22 * 2 + lVar11);
    uVar23 = (uVar30 >> 0xb) * (uint)uVar3;
    uVar9 = uVar22 * 2;
    uVar13 = uVar24 - uVar23;
    if (uVar24 < uVar23) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar13 = uVar24;
    }
    else {
      uVar23 = uVar30 - uVar23;
      sVar6 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar22 * 2 + lVar11) = sVar6 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar11);
    if (uVar23 < 0x1000000) {
      uVar23 = uVar23 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar13 = (uint)bVar1 | uVar13 << 8;
    }
    uVar30 = (uVar23 >> 0xb) * (uint)uVar3;
    uVar22 = uVar9 * 2;
    uVar24 = uVar13 - uVar30;
    if (uVar13 < uVar30) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar24 = uVar13;
    }
    else {
      uVar30 = uVar23 - uVar30;
      sVar6 = -(uVar3 >> 5);
      uVar22 = uVar22 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar11) = sVar6 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar22 * 2 + lVar11);
    if (uVar30 < 0x1000000) {
      uVar30 = uVar30 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar24 = (uint)bVar1 | uVar24 << 8;
    }
    uVar23 = (uVar30 >> 0xb) * (uint)uVar3;
    uVar9 = uVar22 * 2;
    uVar13 = uVar24 - uVar23;
    if (uVar24 < uVar23) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar13 = uVar24;
    }
    else {
      uVar23 = uVar30 - uVar23;
      sVar6 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar22 * 2 + lVar11) = sVar6 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar11);
    if (uVar23 < 0x1000000) {
      uVar23 = uVar23 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar13 = (uint)bVar1 | uVar13 << 8;
    }
    uVar26 = (uVar23 >> 0xb) * (uint)uVar3;
    uVar24 = uVar9 * 2;
    uVar30 = uVar13 - uVar26;
    if (uVar13 < uVar26) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar30 = uVar13;
    }
    else {
      uVar26 = uVar23 - uVar26;
      sVar6 = -(uVar3 >> 5);
      uVar24 = uVar24 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar11) = sVar6 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar24 * 2 + lVar11);
    if (uVar26 < 0x1000000) {
      uVar26 = uVar26 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar30 = (uint)bVar1 | uVar30 << 8;
    }
    uVar22 = (uVar26 >> 0xb) * (uint)uVar3;
    uVar13 = uVar24 * 2;
    uVar9 = uVar30 - uVar22;
    if (uVar30 < uVar22) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar9 = uVar30;
    }
    else {
      uVar22 = uVar26 - uVar22;
      sVar6 = -(uVar3 >> 5);
      uVar13 = uVar13 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar24 * 2 + lVar11) = sVar6 + uVar3;
    uVar24 = uVar13 - 0x40;
    if (uVar24 < 4) {
LAB_00197566:
      uVar30 = UVar25;
      if (uVar15 != 0) {
        uVar30 = uVar15;
      }
      if (uVar30 <= uVar24) {
        return 1;
      }
      uVar27 = (uint)(0x12 < uVar27) * 3 + 7;
      local_b8 = local_cc;
      local_cc = local_c8;
      local_c8 = local_d0;
      local_d0 = uVar24 + 1;
      goto LAB_001975c3;
    }
    uVar30 = uVar13 & 1 | 2;
    if (uVar24 < 0xe) {
      iVar14 = (uVar24 >> 1) - 1;
      uVar30 = uVar30 << ((byte)iVar14 & 0x1f);
      uVar18 = (ulong)uVar24;
      uVar13 = 1;
      uVar17 = 1;
      uVar24 = uVar30;
      do {
        uVar23 = uVar22;
        if (uVar22 < 0x1000000) {
          uVar23 = uVar22 << 8;
          bVar1 = *pbVar28;
          pbVar28 = pbVar28 + 1;
          uVar9 = uVar9 << 8 | (uint)bVar1;
        }
        uVar3 = pUVar4[(ulong)uVar30 + ((uVar17 + 0x2af) - uVar18)];
        uVar22 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar26 = (int)uVar17 * 2;
        uVar31 = uVar9 - uVar22;
        if (uVar9 < uVar22) {
          sVar6 = (short)(0x800 - uVar3 >> 5);
        }
        else {
          uVar22 = uVar23 - uVar22;
          sVar6 = -(uVar3 >> 5);
          uVar26 = uVar26 | 1;
          uVar24 = uVar24 | uVar13;
          uVar9 = uVar31;
        }
        pUVar4[(ulong)uVar30 + ((uVar17 + 0x2af) - uVar18)] = sVar6 + uVar3;
        uVar13 = uVar13 * 2;
        iVar14 = iVar14 + -1;
        uVar17 = (ulong)uVar26;
      } while (iVar14 != 0);
      goto LAB_00197566;
    }
    iVar14 = (uVar24 >> 1) - 5;
    do {
      uVar24 = uVar22;
      if (uVar22 < 0x1000000) {
        bVar1 = *pbVar28;
        pbVar28 = pbVar28 + 1;
        uVar9 = (uint)bVar1 | uVar9 << 8;
        uVar24 = uVar22 << 8;
      }
      uVar22 = uVar24 >> 1;
      uVar13 = (int)(uVar9 - uVar22) >> 0x1f;
      uVar30 = uVar13 + uVar30 * 2 + 1;
      uVar9 = (uVar13 & uVar22) + (uVar9 - uVar22);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    if (uVar24 < 0x2000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar9 = (uint)bVar1 | uVar9 * 0x100;
    }
    uVar24 = uVar30 * 0x10;
    uVar3 = pUVar4[0x323];
    uVar13 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar30 = uVar9 - uVar13;
    if (uVar9 < uVar13) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar22 = 2;
      uVar30 = uVar9;
    }
    else {
      uVar13 = uVar22 - uVar13;
      sVar6 = -(uVar3 >> 5);
      uVar24 = uVar24 | 1;
      uVar22 = 3;
    }
    pUVar4[0x323] = sVar6 + uVar3;
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar30 = (uint)bVar1 | uVar30 << 8;
    }
    uVar3 = pUVar4[(ulong)uVar22 + 0x322];
    uVar26 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar9 = uVar22 * 2;
    uVar23 = uVar30 - uVar26;
    if (uVar30 < uVar26) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar23 = uVar30;
    }
    else {
      uVar26 = uVar13 - uVar26;
      sVar6 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
      uVar24 = uVar24 | 2;
    }
    pUVar4[(ulong)uVar22 + 0x322] = sVar6 + uVar3;
    uVar3 = pUVar4[(ulong)uVar9 + 0x322];
    if (uVar26 < 0x1000000) {
      uVar26 = uVar26 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar23 = (uint)bVar1 | uVar23 << 8;
    }
    uVar31 = (uVar26 >> 0xb) * (uint)uVar3;
    uVar30 = uVar9 * 2;
    uVar13 = uVar23 - uVar31;
    if (uVar23 < uVar31) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar13 = uVar23;
    }
    else {
      uVar31 = uVar26 - uVar31;
      sVar6 = -(uVar3 >> 5);
      uVar30 = uVar30 | 1;
      uVar24 = uVar24 | 4;
    }
    pUVar4[(ulong)uVar9 + 0x322] = sVar6 + uVar3;
    uVar3 = pUVar4[(ulong)uVar30 + 0x322];
    if (uVar31 < 0x1000000) {
      uVar31 = uVar31 << 8;
      bVar1 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar13 = (uint)bVar1 | uVar13 << 8;
    }
    uVar22 = (uVar31 >> 0xb) * (uint)uVar3;
    uVar9 = uVar13 - uVar22;
    if (uVar13 < uVar22) {
      sVar6 = (short)(0x800 - uVar3 >> 5);
      uVar9 = uVar13;
    }
    else {
      uVar22 = uVar31 - uVar22;
      sVar6 = -(uVar3 >> 5);
      uVar24 = uVar24 | 8;
    }
    pUVar4[(ulong)uVar30 + 0x322] = sVar6 + uVar3;
    if (uVar24 != 0xffffffff) goto LAB_00197566;
    uVar20 = uVar20 + 0x112;
    uVar27 = uVar27 - 0xc;
LAB_00197663:
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar2 = *pbVar28;
      pbVar28 = pbVar28 + 1;
      uVar9 = (uint)bVar2 | uVar9 << 8;
    }
    p->buf = pbVar28;
    p->range = uVar22;
    p->code = uVar9;
    p->remainLen = uVar20;
    p->dicPos = uVar32;
    p->processedPos = UVar25;
    p->reps[0] = local_d0;
    p->reps[1] = local_c8;
    p->reps[2] = local_cc;
    p->reps[3] = local_b8;
    p->state = uVar27;
    uVar15 = (p->prop).dicSize;
    if (uVar15 <= UVar25) {
      p->checkDicSize = uVar15;
    }
    LzmaDec_WriteRem(p,limit);
    uVar32 = p->dicPos;
    if (limit <= uVar32) {
      uVar15 = p->remainLen;
LAB_0019772a:
      if (0x112 < uVar15) {
        p->remainLen = 0x112;
      }
      return 0;
    }
    uVar15 = p->remainLen;
    if ((bufLimit <= p->buf) || (0x111 < uVar15)) goto LAB_0019772a;
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec* p, SizeT limit, const Byte* bufLimit) {
  do {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0) {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    if (p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    LzmaDec_WriteRem(p, limit);
  } while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart) {
    p->remainLen = kMatchSpecLenStart;
  }
  return 0;
}